

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<signed_char,_std::allocator<signed_char>_> *
clickhouse::SliceVector<signed_char>
          (vector<signed_char,_std::allocator<signed_char>_> *vec,size_t begin,size_t len)

{
  __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  *p_Var1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_iterator __first;
  __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  *in_RDX;
  vector<signed_char,_std::allocator<signed_char>_> *in_RSI;
  vector<signed_char,_std::allocator<signed_char>_> *in_RDI;
  vector<signed_char,_std::allocator<signed_char>_> *result;
  vector<signed_char,_std::allocator<signed_char>_> *__n;
  __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  *this;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  in_stack_ffffffffffffffa8;
  unsigned_long local_30;
  undefined1 local_21;
  unsigned_long local_20;
  __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  *local_18;
  vector<signed_char,_std::allocator<signed_char>_> *local_10;
  
  local_21 = 0;
  __n = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x1f8bde);
  this = local_18;
  p_Var1 = (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
            *)std::vector<signed_char,_std::allocator<signed_char>_>::size(local_10);
  if (this < p_Var1) {
    sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(local_10);
    local_30 = sVar2 - (long)local_18;
    puVar3 = std::min<unsigned_long>(&local_20,&local_30);
    local_20 = *puVar3;
    std::vector<signed_char,_std::allocator<signed_char>_>::begin(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
    ::operator+(this,(difference_type)__n);
    __first = std::vector<signed_char,_std::allocator<signed_char>_>::begin(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
    ::operator+(this,(difference_type)__n);
    std::vector<signed_char,std::allocator<signed_char>>::
    assign<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,void>
              (in_stack_ffffffffffffffa0,
               (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                )__first._M_current,in_stack_ffffffffffffffa8);
  }
  return __n;
}

Assistant:

std::vector<T> SliceVector(const std::vector<T>& vec, size_t begin, size_t len) {
    std::vector<T> result;

    if (begin < vec.size()) {
        len = std::min(len, vec.size() - begin);
        result.assign(vec.begin() + begin, vec.begin() + (begin + len));
    }

    return result;
}